

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Codec.cpp
# Opt level: O1

int higan::Codec::HexCharArrayToInt(char *begin,char *end)

{
  char cVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  double dVar5;
  
  if (begin < end) {
    iVar4 = ~(uint)begin + (int)end;
    iVar2 = 0;
    do {
      cVar1 = *begin;
      iVar3 = (int)cVar1;
      dVar5 = exp2((double)iVar4 * 4.0);
      if ((byte)(cVar1 + 0x9fU) < 6) {
        iVar3 = iVar3 + -0x57;
      }
      else if ((byte)(cVar1 + 0xbfU) < 6) {
        iVar3 = iVar3 + -0x37;
      }
      else {
        iVar3 = iVar3 + -0x30;
        if (9 < (byte)(cVar1 - 0x30U)) {
          iVar3 = -1;
        }
      }
      iVar2 = (int)(dVar5 * (double)iVar3 + (double)iVar2);
      begin = begin + 1;
      iVar4 = iVar4 + -1;
    } while (begin != end);
    iVar4 = -1;
    if (-1 < iVar2) {
      iVar4 = iVar2;
    }
    return iVar4;
  }
  return -1;
}

Assistant:

int Codec::HexCharArrayToInt(const char* begin, const char* end)
{
	if (end <= begin)
	{
		return -1;
	}

	int index = end - begin - 1;

	int result = 0;

	std::for_each(begin, end, [&](char i)
	{
		result += std::pow(16, index--) * HexCharToInt(i);
	});

	return result < 0 ? -1 : result;
}